

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdInitializeFundRawTx
              (void *handle,int network_type,uint32_t target_asset_count,char *fee_asset,
              void **fund_handle)

{
  pointer *ppuVar1;
  bool bVar2;
  int iVar3;
  undefined8 *__dest;
  undefined8 *puVar4;
  vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
  *this;
  CfdException *pCVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool is_bitcoin;
  ConfidentialAssetId asset_data;
  string asset_hex;
  CfdCapiFundRawTxData obj;
  uint8_t empty_asset [33];
  bool local_151;
  ConfidentialAssetId local_150;
  undefined1 local_128 [32];
  string local_108;
  undefined1 local_e8 [36];
  undefined8 local_c4;
  undefined8 uStack_bc;
  uchar local_b4;
  undefined1 local_b3;
  undefined1 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  undefined8 uStack_40;
  undefined1 local_38;
  
  cfd::Initialize();
  if (fund_handle == (void **)0x0) {
    local_e8._0_8_ = "cfdcapi_transaction.cpp";
    local_e8._8_4_ = 0xb43;
    local_e8._16_4_ = 0x5e4969;
    local_e8._20_4_ = 0;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_e8,kCfdLogLevelWarning,"fund handle is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Failed to parameter. fund handle is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_e8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (target_asset_count == 0) {
    local_e8._0_8_ = "cfdcapi_transaction.cpp";
    local_e8._8_4_ = 0xb49;
    local_e8._16_4_ = 0x5e4969;
    local_e8._20_4_ = 0;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_e8,kCfdLogLevelWarning,"target_asset_count is zero.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Failed to parameter. target_asset_count is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_e8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  memset(local_e8,0,0x90);
  local_151 = false;
  local_e8._16_4_ = cfd::capi::ConvertNetType(network_type,&local_151);
  bVar2 = cfd::capi::IsEmptyString(fee_asset);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_108,fee_asset,(allocator *)&local_150);
    if (local_108._M_string_length == 0) {
      bVar2 = false;
    }
    else {
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_150,&local_108);
      cfd::core::ConfidentialAssetId::GetData((ByteData *)local_128,&local_150);
      cfd::core::ByteData::GetBytes(&local_58,(ByteData *)local_128);
      local_b4 = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[0x20];
      local_e8._28_8_ =
           *(undefined8 *)
            (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 8);
      local_c4 = *(undefined8 *)
                  (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + 0x10);
      uStack_bc = *(undefined8 *)
                   (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + 0x18);
      local_e8._20_4_ =
           (undefined4)
           *(undefined8 *)
            local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
      local_e8._24_4_ =
           (undefined4)
           ((ulong)*(undefined8 *)
                    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 0x20);
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      if ((pointer)local_128._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_128._0_8_);
      }
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uStack_40 = 0;
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38 = 0;
      iVar3 = bcmp(local_e8 + 0x14,&local_58,0x21);
      if (iVar3 == 0) {
        bVar2 = false;
      }
      else {
        local_b3 = 1;
        bVar2 = true;
        if (local_151 == true) {
          local_128._0_8_ = "cfdcapi_transaction.cpp";
          local_128._8_4_ = 0xb5f;
          local_128._16_8_ = "CfdInitializeFundRawTx";
          cfd::core::logger::log<>
                    ((CfdSourceLocation *)local_128,kCfdLogLevelWarning,
                     "network type is not elements.");
          pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
          local_128._0_8_ = local_128 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_128,"Failed to parameter. network type is not elements.","");
          cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_128)
          ;
          __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,
                      cfd::core::CfdException::~CfdException);
        }
      }
      local_150._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
      if ((void *)CONCAT44(local_150.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_150.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_150.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_150.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_));
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  if (bVar2 != local_151) {
    local_80 = 0;
    if (bVar2 == false) {
      uVar6 = 0;
      uVar7 = 0x40340000;
    }
    else {
      uVar6 = 0x33333333;
      uVar7 = 0x3fc33333;
    }
    local_70 = CONCAT44(uVar7,uVar6);
    local_78 = 0x4008000000000000;
    local_68 = 0xffffffffffffffff;
    local_60 = 0x2400000000;
    ppuVar1 = (pointer *)
              ((long)&local_150.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data + 8);
    local_150._vptr_ConfidentialAssetId = (_func_int **)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"FundRawTxData","");
    __dest = (undefined8 *)cfd::capi::AllocBuffer((string *)&local_150,0x90);
    if (local_150._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
      operator_delete(local_150._vptr_ConfidentialAssetId);
    }
    local_e8._0_8_ = *__dest;
    local_e8._8_8_ = __dest[1];
    memcpy(__dest,local_e8,0x90);
    puVar4 = (undefined8 *)operator_new(0x18);
    *puVar4 = 0;
    puVar4[1] = 0;
    puVar4[2] = 0;
    __dest[7] = puVar4;
    puVar4 = (undefined8 *)operator_new(0x18);
    *puVar4 = 0;
    puVar4[1] = 0;
    puVar4[2] = 0;
    __dest[8] = puVar4;
    puVar4 = (undefined8 *)operator_new(0x18);
    *puVar4 = 0;
    puVar4[1] = 0;
    puVar4[2] = 0;
    __dest[9] = puVar4;
    this = (vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
            *)operator_new(0x18);
    std::
    vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
    ::vector(this,(ulong)target_asset_count,(allocator_type *)&local_150);
    __dest[0xb] = this;
    puVar4 = (undefined8 *)operator_new(0x18);
    *puVar4 = 0;
    puVar4[1] = 0;
    puVar4[2] = 0;
    __dest[10] = puVar4;
    *fund_handle = __dest;
    return 0;
  }
  local_150._vptr_ConfidentialAssetId = (_func_int **)0x5e44da;
  local_150.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xb6b;
  local_150.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "CfdInitializeFundRawTx";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_150,kCfdLogLevelWarning,"network type not is bitcoin.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_150._vptr_ConfidentialAssetId =
       (_func_int **)
       ((long)&local_150.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"Failed to parameter. network type is not bitcoin.","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_150);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeFundRawTx(
    void* handle, int network_type, uint32_t target_asset_count,
    const char* fee_asset, void** fund_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiFundRawTxData* buffer = nullptr;
  try {
    cfd::Initialize();
    if (fund_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "fund handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fund handle is null.");
    }
    if (target_asset_count == 0) {
      warn(CFD_LOG_SOURCE, "target_asset_count is zero.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. target_asset_count is null.");
    }
    CfdCapiFundRawTxData obj;
    memset(&obj, 0, sizeof(obj));
    bool is_bitcoin = false;
    obj.net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!IsEmptyString(fee_asset)) {
#ifndef CFD_DISABLE_ELEMENTS
      std::string asset_hex(fee_asset);
      if (!asset_hex.empty()) {
        ConfidentialAssetId asset_data(asset_hex);
        memcpy(
            obj.fee_asset, asset_data.GetData().GetBytes().data(),
            sizeof(obj.fee_asset));
        uint8_t empty_asset[kAssetSize];
        memset(empty_asset, 0, sizeof(empty_asset));
        if (memcmp(obj.fee_asset, empty_asset, sizeof(empty_asset)) != 0) {
          obj.is_elements = true;
          if (is_bitcoin) {
            warn(CFD_LOG_SOURCE, "network type is not elements.");
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "Failed to parameter. network type is not elements.");
          }
        }
      }
#else
      info(CFD_LOG_SOURCE, "unuse asset[{}]", fee_asset);
#endif  // CFD_DISABLE_ELEMENTS
    }
    if (obj.is_elements == is_bitcoin) {
      warn(CFD_LOG_SOURCE, "network type not is bitcoin.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. network type is not bitcoin.");
    }
    obj.is_blind = false;
    obj.long_term_fee_rate = (obj.is_elements) ? 0.15 : 20.0;
    obj.dust_fee_rate = 3.0;
    obj.knapsack_min_change = -1;
    obj.exponent = 0;
    obj.minimum_bits = cfd::capi::kMinimumBits;  // = 36(old)

    buffer = static_cast<CfdCapiFundRawTxData*>(
        AllocBuffer(kPrefixFundRawTxData, sizeof(CfdCapiFundRawTxData)));
    memcpy(obj.prefix, buffer->prefix, sizeof(obj.prefix));
    *buffer = obj;
    buffer->utxos = new std::vector<UtxoData>();
    buffer->input_utxos = new std::vector<UtxoData>();
#ifndef CFD_DISABLE_ELEMENTS
    buffer->input_elements_utxos = new std::vector<ElementsUtxoAndOption>();
#endif  // CFD_DISABLE_ELEMENTS
    buffer->targets =
        new std::vector<CfdCapiFundTargetAmount>(target_asset_count);
    buffer->append_txout_addresses = new std::vector<std::string>();
    *fund_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  if (buffer != nullptr) CfdFreeFundRawTxHandle(handle, buffer);
  return result;
}